

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O3

bool __thiscall csv::icu::DataSource::is_eol(DataSource *this)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this->_current != 10) {
    if (this->_current == 0xd) {
      iVar1 = (*(this->super_IDataSource)._vptr_IDataSource[2])();
      if (((char)iVar1 != '\0') && (this->_current != 10)) {
        (*(this->super_IDataSource)._vptr_IDataSource[3])(this);
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool DataSource::is_eol() {
		if (_current == '\r') {
			if (next() == false) {
				// Hit the end of file.  Return true and let the caller handle it
				return true;
			}

			if (_current != '\n') {
				back();
			}
			return true;
		}
		else if (_current == '\n') {
			return true;
		}
		return false;
	}